

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O0

void __thiscall limonp::Logger::Logger(Logger *this,size_t level,char *filename,int lineno)

{
  undefined *__format;
  tm *__tp;
  ostream *poVar1;
  int in_ECX;
  char *in_RDX;
  undefined8 in_RSI;
  ostringstream *in_RDI;
  time_t now;
  char buf [32];
  time_t local_50;
  char local_48 [44];
  int local_1c;
  char *local_18;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(in_RDI);
  *(undefined8 *)(in_RDI + 0x178) = local_10;
  if (*(ulong *)(in_RDI + 0x178) < 6) {
    time(&local_50);
    __format = LOG_TIME_FORMAT;
    __tp = localtime(&local_50);
    strftime(local_48,0x20,__format,__tp);
    poVar1 = std::operator<<((ostream *)in_RDI,local_48);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,*(char **)(LOG_LEVEL_ARRAY + *(long *)(in_RDI + 0x178) * 8));
    std::operator<<(poVar1," ");
    return;
  }
  __assert_fail("level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/Logging.hpp"
                ,0x2a,"limonp::Logger::Logger(size_t, const char *, int)");
}

Assistant:

Logger(size_t level, const char* filename, int lineno)
   : level_(level) {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    assert(level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY));
    char buf[32];
    time_t now;
    time(&now);
    strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&now));
    stream_ << buf 
      << " " << filename 
      << ":" << lineno 
      << " " << LOG_LEVEL_ARRAY[level_] 
      << " ";
  }